

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMakeArray
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  unsigned_long uVar3;
  uint uVar4;
  pointer pFVar5;
  pointer pVVar6;
  HeapEntity *pHVar7;
  Identifier *pIVar8;
  HeapObject *pHVar9;
  AST *pAVar10;
  _func_int **pp_Var11;
  pointer ppHVar12;
  HeapThunk *from;
  long lVar13;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  mapped_type from_00;
  mapped_type *ppHVar16;
  RuntimeError *pRVar17;
  allocator_type *in_RCX;
  value_type *__val_1;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *this_00;
  BindingFrame *pBVar18;
  LocationRange *__n;
  Interpreter *__x;
  _Rb_tree_header *p_Var19;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar25;
  value_type *__val;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  elements;
  HeapThunk *th;
  stringstream ss;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  local_238;
  Stack *local_220;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *local_218;
  BindingFrame *local_210;
  pointer local_208;
  string local_200;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_1e0;
  HeapEntity *local_1d8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1d0;
  undefined1 local_1b8 [392];
  
  pFVar5 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"makeArray","");
  local_200._M_dataplus._M_p = (pointer)0x1100000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_200;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_1d0,__l,in_RCX);
  __n = loc;
  validateBuiltinArgs(this,loc,(string *)local_1b8,args,&local_1d0);
  if (local_1d0.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    __n = (LocationRange *)
          ((long)local_1d0.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)local_1d0.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_1d0.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    __n = (LocationRange *)(local_1b8._16_8_ + 1);
    operator_delete((void *)local_1b8._0_8_,(ulong)__n);
  }
  local_220 = &this->stack;
  pVVar6 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var20 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)(long)(pVVar6->v).d;
  if ((long)p_Var20 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"makeArray requires size >= 0, got ",0x22);
    std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
    pRVar17 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar17,local_220,loc,&local_200);
    __cxa_throw(pRVar17,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pHVar7 = pVVar6[1].v.h;
  local_238.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = pFVar5;
  if (*(long *)&pHVar7[5].mark - (long)pHVar7[5]._vptr_HeapEntity != 0x10) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"makeArray function must take 1 param, got: ",0x2b);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    pRVar17 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar17,local_220,loc,&local_200);
    __cxa_throw(pRVar17,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (p_Var20 !=
      (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
       *)0x0) {
    if (p_Var20 ==
        (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
         *)0x0) {
      uRam0000000000000000 = 0;
      memset((void *)0x8,0,0xfffffffffffffff8);
      local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      local_218 = (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                   *)0x0;
      if ((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)0xfffffffffffffff < p_Var20) {
        std::__throw_length_error("vector::_M_default_append");
      }
      this_00 = p_Var20;
      if ((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)0xffffffffffffffe < p_Var20) {
        this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)0xfffffffffffffff;
      }
      ppHVar12 = std::
                 _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 ::_M_allocate(this_00,(size_t)__n);
      *ppHVar12 = (HeapThunk *)0x0;
      if (p_Var20 !=
          (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)0x1) {
        memset(ppHVar12 + 1,0,(long)p_Var20 * 8 - 8);
      }
      local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppHVar12 + (long)p_Var20;
      local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppHVar12 + (long)this_00;
      local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppHVar12;
    }
  }
  if (p_Var20 !=
      (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
       *)0x0) {
    local_218 = &(this->heap).entities;
    p_Var1 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
    local_208 = (pointer)&local_208[-1].thunks;
    local_1d8 = pHVar7 + 1;
    local_1e0 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)0x1;
    if (1 < (long)p_Var20) {
      local_1e0 = p_Var20;
    }
    pBVar18 = (BindingFrame *)0x0;
    do {
      from = (HeapThunk *)operator_new(0x70);
      pIVar8 = this->idArrayElement;
      pHVar9 = (HeapObject *)pHVar7[4]._vptr_HeapEntity;
      uVar4 = *(uint *)&pHVar7[4].mark;
      pAVar10 = *(AST **)&pHVar7[6].mark;
      *(undefined2 *)&(from->super_HeapEntity).type = 0;
      (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_00299498;
      from->name = pIVar8;
      p_Var19 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
      (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var19->_M_header;
      (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var19->_M_header;
      (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      from->self = pHVar9;
      from->offset = uVar4;
      from->body = pAVar10;
      local_1b8._0_8_ = from;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::push_back(local_218,(value_type *)local_1b8);
      (from->super_HeapEntity).mark = (this->heap).lastMark;
      lVar13 = (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = lVar13 >> 3;
      (this->heap).numEntities = uVar14;
      if (((this->heap).gcTuneMinObjects < uVar14) &&
         (auVar21._8_4_ = (int)(lVar13 >> 0x23), auVar21._0_8_ = uVar14, auVar21._12_4_ = 0x45300000
         , uVar3 = (this->heap).lastNumEntities, auVar22._8_4_ = (int)(uVar3 >> 0x20),
         auVar22._0_8_ = uVar3, auVar22._12_4_ = 0x45300000,
         ((auVar22._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
         (this->heap).gcTuneGrowthTrigger <
         (auVar21._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0))) {
        Heap::markFrom(&this->heap,(HeapEntity *)from);
        Stack::mark(local_220,&this->heap);
        if (((this->scratch).t & ARRAY) != NULL_TYPE) {
          Heap::markFrom(&this->heap,(this->scratch).v.h);
        }
        for (p_Var15 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != p_Var1;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          if (*(HeapEntity **)(*(long *)(p_Var15 + 3) + 0x40) != (HeapEntity *)0x0) {
            Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var15 + 3) + 0x40));
          }
        }
        for (p_Var15 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != p_Var2;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var15 + 2));
        }
        Heap::sweep(&this->heap);
      }
      local_200._M_dataplus._M_p = (pointer)from;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)local_208,(value_type *)&local_200);
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::operator=(&from->upValues,
                  (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                   *)local_1d8);
      pp_Var11 = pHVar7[5]._vptr_HeapEntity;
      from_00 = (mapped_type)operator_new(0x70);
      pIVar8 = (Identifier *)*pp_Var11;
      *(undefined2 *)&(from_00->super_HeapEntity).type = 0;
      (from_00->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_00299498;
      from_00->name = pIVar8;
      p_Var19 = &(from_00->upValues)._M_t._M_impl.super__Rb_tree_header;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var19->_M_header
      ;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var19->_M_header;
      from_00->body = (AST *)0x0;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      from_00->self = (HeapObject *)0x0;
      from_00->offset = 0;
      __x = (Interpreter *)local_1b8;
      local_1b8._0_8_ = from_00;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::push_back(local_218,(value_type *)__x);
      (from_00->super_HeapEntity).mark = (this->heap).lastMark;
      lVar13 = (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = lVar13 >> 3;
      (this->heap).numEntities = uVar14;
      if (((this->heap).gcTuneMinObjects < uVar14) &&
         (auVar23._8_4_ = (int)(lVar13 >> 0x23), auVar23._0_8_ = uVar14, auVar23._12_4_ = 0x45300000
         , uVar3 = (this->heap).lastNumEntities, auVar24._8_4_ = (int)(uVar3 >> 0x20),
         auVar24._0_8_ = uVar3, auVar24._12_4_ = 0x45300000,
         ((auVar24._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
         (this->heap).gcTuneGrowthTrigger <
         (auVar23._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0))) {
        Heap::markFrom(&this->heap,(HeapEntity *)from_00);
        __x = this;
        Stack::mark(local_220,&this->heap);
        if (((this->scratch).t & ARRAY) != NULL_TYPE) {
          __x = (Interpreter *)(this->scratch).v.h;
          Heap::markFrom(&this->heap,(HeapEntity *)__x);
        }
        local_210 = pBVar18;
        for (p_Var15 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != p_Var1;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          __x = *(Interpreter **)(*(long *)(p_Var15 + 3) + 0x40);
          if (__x != (Interpreter *)0x0) {
            Heap::markFrom(&this->heap,(HeapEntity *)__x);
          }
        }
        for (p_Var15 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != p_Var2;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          __x = *(Interpreter **)(p_Var15 + 2);
          Heap::markFrom(&this->heap,(HeapEntity *)__x);
        }
        Heap::sweep(&this->heap);
        pBVar18 = local_210;
      }
      local_1b8._0_8_ = (undefined8)(long)pBVar18;
      (from_00->content).t = NUMBER;
      (from_00->content).v.d = (double)local_1b8._0_8_;
      (from_00->super_HeapEntity).field_0xa = 1;
      from_00->self = (HeapObject *)0x0;
      local_210 = &from->upValues;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)__x);
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var19->_M_header
      ;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var19->_M_header;
      (from_00->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ppHVar16 = std::
                 map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 ::operator[](local_210,(key_type *)pHVar7[5]._vptr_HeapEntity);
      *ppHVar16 = from_00;
      local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pBVar18] = from;
      pBVar18 = (BindingFrame *)
                ((long)&(((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                           *)pBVar18)->_M_impl).super__Vector_impl_data._M_start + 1);
    } while (pBVar18 != (BindingFrame *)local_1e0);
  }
  VVar25 = makeArray(this,&local_238);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar25._0_8_;
  if (local_238.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinMakeArray(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "makeArray", args, {Value::NUMBER, Value::FUNCTION});
        long sz = long(args[0].v.d);
        if (sz < 0) {
            std::stringstream ss;
            ss << "makeArray requires size >= 0, got " << sz;
            throw makeError(loc, ss.str());
        }
        auto *func = static_cast<const HeapClosure *>(args[1].v.h);
        std::vector<HeapThunk *> elements;
        if (func->params.size() != 1) {
            std::stringstream ss;
            ss << "makeArray function must take 1 param, got: " << func->params.size();
            throw makeError(loc, ss.str());
        }
        elements.resize(sz);
        for (long i = 0; i < sz; ++i) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, func->self, func->offset, func->body);
            // The next line stops the new thunks from being GCed.
            f.thunks.push_back(th);
            th->upValues = func->upValues;

            auto *el = makeHeap<HeapThunk>(func->params[0].id, nullptr, 0, nullptr);
            el->fill(makeNumber(i));  // i guaranteed not to be inf/NaN
            th->upValues[func->params[0].id] = el;
            elements[i] = th;
        }
        scratch = makeArray(elements);
        return nullptr;
    }